

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CompactHandler::CompactHandler
          (CompactHandler *this,CompactStyle compactStyle,Locale *locale,char *nsName,
          CompactType compactType,PluralRules *rules,MutablePatternModifier *buildReference,
          MicroPropsGenerator *parent,UErrorCode *status)

{
  PluralRules *rules_local;
  CompactType compactType_local;
  char *nsName_local;
  Locale *locale_local;
  CompactStyle compactStyle_local;
  CompactHandler *this_local;
  
  MicroPropsGenerator::MicroPropsGenerator(&this->super_MicroPropsGenerator);
  (this->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
       (_func_int **)&PTR__CompactHandler_004af118;
  this->rules = rules;
  this->parent = parent;
  MaybeStackArray<icu_63::number::impl::CompactModInfo,_12>::MaybeStackArray(&this->precomputedMods)
  ;
  this->precomputedModsLength = 0;
  CompactData::CompactData(&this->data);
  ParsedPatternInfo::ParsedPatternInfo(&this->unsafePatternInfo);
  CompactData::populate(&this->data,locale,nsName,compactStyle,compactType,status);
  if (buildReference == (MutablePatternModifier *)0x0) {
    this->safe = '\0';
  }
  else {
    precomputeAllModifiers(this,buildReference,status);
    this->safe = '\x01';
  }
  return;
}

Assistant:

CompactHandler::CompactHandler(CompactStyle compactStyle, const Locale &locale, const char *nsName,
                               CompactType compactType, const PluralRules *rules,
                               MutablePatternModifier *buildReference, const MicroPropsGenerator *parent,
                               UErrorCode &status)
        : rules(rules), parent(parent) {
    data.populate(locale, nsName, compactStyle, compactType, status);
    if (buildReference != nullptr) {
        // Safe code path
        precomputeAllModifiers(*buildReference, status);
        safe = TRUE;
    } else {
        // Unsafe code path
        safe = FALSE;
    }
}